

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

hugeint_t duckdb::GreatestCommonDivisor<duckdb::hugeint_t>(hugeint_t left,hugeint_t right)

{
  hugeint_t input;
  bool bVar1;
  uint64_t in_RDX;
  uint64_t in_RSI;
  hugeint_t a;
  hugeint_t b;
  hugeint_t local_a8;
  hugeint_t local_78;
  hugeint_t local_68;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t local_28;
  
  local_68.lower = 0;
  local_68.upper = -0x8000000000000000;
  bVar1 = hugeint_t::operator==(&local_58,&local_68);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_28,-1);
    bVar1 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff78,&local_28);
    if (!bVar1) goto LAB_01c2f121;
LAB_01c2f164:
    hugeint_t::hugeint_t(&local_a8,1);
  }
  else {
LAB_01c2f121:
    hugeint_t::hugeint_t(&local_38,-1);
    bVar1 = hugeint_t::operator==(&local_58,&local_38);
    if (bVar1) {
      local_48.lower = 0;
      local_48.upper = -0x8000000000000000;
      bVar1 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff78,&local_48);
      if (bVar1) goto LAB_01c2f164;
    }
    hugeint_t::hugeint_t(&local_68,0);
    bVar1 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff68,&local_68);
    if (!bVar1) {
      do {
        hugeint_t::operator%=(&local_78,(hugeint_t *)&stack0xffffffffffffff68);
        hugeint_t::hugeint_t(&local_68,0);
        bVar1 = hugeint_t::operator==(&local_78,&local_68);
        if (bVar1) break;
        hugeint_t::operator%=((hugeint_t *)&stack0xffffffffffffff68,&local_78);
        hugeint_t::hugeint_t(&local_68,0);
        bVar1 = hugeint_t::operator==((hugeint_t *)&stack0xffffffffffffff68,&local_68);
      } while (!bVar1);
    }
    input.upper = in_RDX;
    input.lower = in_RSI;
    local_a8 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input);
  }
  return local_a8;
}

Assistant:

TA GreatestCommonDivisor(TA left, TA right) {
	TA a = left;
	TA b = right;

	// This protects the following modulo operations from a corner case,
	// where we would get a runtime error due to an integer overflow.
	if ((left == NumericLimits<TA>::Minimum() && right == -1) ||
	    (left == -1 && right == NumericLimits<TA>::Minimum())) {
		return 1;
	}

	while (true) {
		if (a == 0) {
			return TryAbsOperator::Operation<TA, TA>(b);
		}
		b %= a;

		if (b == 0) {
			return TryAbsOperator::Operation<TA, TA>(a);
		}
		a %= b;
	}
}